

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall cmGraphVizWriter::WriteLegend(cmGraphVizWriter *this,cmGeneratedFileStream *fs)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)fs,
                           "subgraph clusterLegend {\n  label = \"Legend\";\n  color = black;\n  edge [ style = invis ];\n  legendNode0 [ label = \"Executable\", shape = "
                          );
  poVar1 = std::operator<<(poVar1,"egg");
  poVar1 = std::operator<<(poVar1," ];\n  legendNode1 [ label = \"Static Library\", shape = ");
  poVar1 = std::operator<<(poVar1,"octagon");
  poVar1 = std::operator<<(poVar1," ];\n  legendNode2 [ label = \"Shared Library\", shape = ");
  poVar1 = std::operator<<(poVar1,"doubleoctagon");
  poVar1 = std::operator<<(poVar1," ];\n  legendNode3 [ label = \"Module Library\", shape = ");
  poVar1 = std::operator<<(poVar1,"tripleoctagon");
  poVar1 = std::operator<<(poVar1," ];\n  legendNode4 [ label = \"Interface Library\", shape = ");
  poVar1 = std::operator<<(poVar1,"pentagon");
  poVar1 = std::operator<<(poVar1," ];\n  legendNode5 [ label = \"Object Library\", shape = ");
  poVar1 = std::operator<<(poVar1,"hexagon");
  poVar1 = std::operator<<(poVar1," ];\n  legendNode6 [ label = \"Unknown Library\", shape = ");
  poVar1 = std::operator<<(poVar1,"septagon");
  poVar1 = std::operator<<(poVar1," ];\n  legendNode7 [ label = \"Custom Target\", shape = ");
  poVar1 = std::operator<<(poVar1,"box");
  poVar1 = std::operator<<(poVar1," ];\n  legendNode0 -> legendNode1 [ style = ");
  poVar1 = std::operator<<(poVar1,"solid");
  poVar1 = std::operator<<(poVar1," ];\n  legendNode0 -> legendNode2 [ style = ");
  poVar1 = std::operator<<(poVar1,"solid");
  poVar1 = std::operator<<(poVar1,
                           " ];\n  legendNode0 -> legendNode3;\n  legendNode1 -> legendNode4 [ label = \"Interface\", style = "
                          );
  poVar1 = std::operator<<(poVar1,"dashed");
  poVar1 = std::operator<<(poVar1,
                           " ];\n  legendNode2 -> legendNode5 [ label = \"Private\", style = ");
  poVar1 = std::operator<<(poVar1,"dotted");
  poVar1 = std::operator<<(poVar1," ];\n  legendNode3 -> legendNode6 [ style = ");
  poVar1 = std::operator<<(poVar1,"solid");
  std::operator<<(poVar1," ];\n  legendNode0 -> legendNode7;\n}\n");
  return;
}

Assistant:

void cmGraphVizWriter::WriteLegend(cmGeneratedFileStream& fs)
{
  // Note that the subgraph name must start with "cluster", as done here, to
  // make Graphviz layout engines do the right thing and keep the nodes
  // together.
  /* clang-format off */
  fs << "subgraph clusterLegend {\n"
        "  label = \"Legend\";\n"
        // Set the color of the box surrounding the legend.
        "  color = black;\n"
        // We use invisible edges just to enforce the layout.
        "  edge [ style = invis ];\n"
        // Nodes.
        "  legendNode0 [ label = \"Executable\", shape = "
     << GRAPHVIZ_NODE_SHAPE_EXECUTABLE << " ];\n"
        "  legendNode1 [ label = \"Static Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_STATIC << " ];\n"
        "  legendNode2 [ label = \"Shared Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_SHARED << " ];\n"
        "  legendNode3 [ label = \"Module Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_MODULE << " ];\n"
        "  legendNode4 [ label = \"Interface Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_INTERFACE << " ];\n"
        "  legendNode5 [ label = \"Object Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_OBJECT << " ];\n"
        "  legendNode6 [ label = \"Unknown Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_UNKNOWN << " ];\n"
        "  legendNode7 [ label = \"Custom Target\", shape = "
     << GRAPHVIZ_NODE_SHAPE_UTILITY << " ];\n"
        // Edges.
        // Some of those are dummy (invisible) edges to enforce a layout.
        "  legendNode0 -> legendNode1 [ style = "
     << GRAPHVIZ_EDGE_STYLE_PUBLIC << " ];\n"
        "  legendNode0 -> legendNode2 [ style = "
     << GRAPHVIZ_EDGE_STYLE_PUBLIC << " ];\n"
        "  legendNode0 -> legendNode3;\n"
        "  legendNode1 -> legendNode4 [ label = \"Interface\", style = "
     << GRAPHVIZ_EDGE_STYLE_INTERFACE << " ];\n"
        "  legendNode2 -> legendNode5 [ label = \"Private\", style = "
     << GRAPHVIZ_EDGE_STYLE_PRIVATE << " ];\n"
        "  legendNode3 -> legendNode6 [ style = "
     << GRAPHVIZ_EDGE_STYLE_PUBLIC << " ];\n"
        "  legendNode0 -> legendNode7;\n"
        "}\n";
  /* clang-format off */
}